

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

size_t HTTPResponseCallback(void *ptr,size_t size,size_t nmemb,void *data)

{
  std::__cxx11::string::append((char *)data);
  return (long)((int)size * (int)nmemb);
}

Assistant:

static size_t
HTTPResponseCallback(void *ptr, size_t size, size_t nmemb, void *data)
{
  int realsize = (int)(size * nmemb);

  std::string *response
    = static_cast<std::string*>(data);
  const char* chPtr = static_cast<char*>(ptr);
  *response += chPtr;

  return realsize;
}